

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O3

Vec_Int_t * Saig_ManCbaPerform(Aig_Man_t *pAbs,int nInputs,Saig_ParBmc_t *pPars)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  long lVar4;
  Abc_Cex_t *p;
  int level;
  long lVar5;
  timespec ts;
  timespec local_38;
  
  iVar2 = clock_gettime(3,&local_38);
  if (iVar2 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_38.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_38.tv_sec * -1000000;
  }
  iVar2 = Saig_ManBmcScalable(pAbs,pPars);
  if (iVar2 == -1) {
    puts("Resource limit is reached during BMC.");
    if (pAbs->pSeqModel != (Abc_Cex_t *)0x0) {
      __assert_fail("pAbs->pSeqModel == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absOldCex.c"
                    ,0x349,"Vec_Int_t *Saig_ManCbaPerform(Aig_Man_t *, int, Saig_ParBmc_t *)");
    }
  }
  else {
    p = pAbs->pSeqModel;
    if (p != (Abc_Cex_t *)0x0) {
      if (pPars->fVerbose == 0) {
        iVar2 = 0;
      }
      else {
        Abc_CexPrintStats(p);
        p = pAbs->pSeqModel;
        iVar2 = pPars->fVerbose;
      }
      pVVar3 = Saig_ManCbaFilterInputs(pAbs,nInputs,p,iVar2);
      uVar1 = pVVar3->nSize;
      if (uVar1 != 0) {
        if (pPars->fVerbose == 0) {
          return pVVar3;
        }
        printf("Adding %d registers to the abstraction (total = %d).  ",(ulong)uVar1,
               (ulong)(pAbs->nRegs + uVar1));
        level = 3;
        iVar2 = clock_gettime(3,&local_38);
        if (iVar2 < 0) {
          lVar5 = -1;
        }
        else {
          lVar5 = local_38.tv_nsec / 1000 + local_38.tv_sec * 1000000;
        }
        Abc_Print(level,"%s =","Time");
        Abc_Print(level,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
        return pVVar3;
      }
      if (pVVar3->pArray != (int *)0x0) {
        free(pVVar3->pArray);
      }
      free(pVVar3);
      return (Vec_Int_t *)0x0;
    }
    puts("BMC did not detect a CEX with the given depth.");
  }
  pVVar3 = (Vec_Int_t *)calloc(1,0x10);
  return pVVar3;
}

Assistant:

Vec_Int_t * Saig_ManCbaPerform( Aig_Man_t * pAbs, int nInputs, Saig_ParBmc_t * pPars )
{
    Vec_Int_t * vAbsFfsToAdd;
    int RetValue;
    abctime clk = Abc_Clock();
//    assert( pAbs->nRegs > 0 );
    // perform BMC
    RetValue = Saig_ManBmcScalable( pAbs, pPars );
    if ( RetValue == -1 ) // time out - nothing to add
    {
        printf( "Resource limit is reached during BMC.\n" );
        assert( pAbs->pSeqModel == NULL );
        return Vec_IntAlloc( 0 );
    }
    if ( pAbs->pSeqModel == NULL )
    {
        printf( "BMC did not detect a CEX with the given depth.\n" );
        return Vec_IntAlloc( 0 );
    }
    if ( pPars->fVerbose )
        Abc_CexPrintStats( pAbs->pSeqModel );
    // CEX is detected - refine the flops
    vAbsFfsToAdd = Saig_ManCbaFilterInputs( pAbs, nInputs, pAbs->pSeqModel, pPars->fVerbose );
    if ( Vec_IntSize(vAbsFfsToAdd) == 0 )
    {
        Vec_IntFree( vAbsFfsToAdd );
        return NULL;
    }
    if ( pPars->fVerbose )
    {
        printf( "Adding %d registers to the abstraction (total = %d).  ", 
            Vec_IntSize(vAbsFfsToAdd), Aig_ManRegNum(pAbs)+Vec_IntSize(vAbsFfsToAdd) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
    return vAbsFfsToAdd;
}